

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O0

void valid_option(int argc,char **argv,char *in_path,char *out_path,float *sigma1,float *sigma2,
                 int *histo,int *sf,float *trsh,char *i_fname,char *v_fname,char *c_fname,
                 char *h_fname,int *nbin,float *incr,int *n_frame,float *alpha,float *delta,
                 int *iter,int *binary,int *row,int *col,int *horn,int *vmag,float *maxv)

{
  int iVar1;
  char local_278 [8];
  string str_delta;
  string str_alpha;
  string str_trsh;
  string str_tg;
  string str_sg;
  string t0;
  string ext;
  int local_3c;
  int i;
  float *sigma2_local;
  float *sigma1_local;
  char *out_path_local;
  char *in_path_local;
  char **argv_local;
  int argc_local;
  
  if (argc == 1) {
    usage();
  }
  if ((argc < 0x1d) && (3 < argc)) {
    *binary = 0;
    *horn = 0;
    *vmag = 0;
    *sf = 0;
    *histo = 0;
    *trsh = 0.0;
    *maxv = 0.0;
    *sigma1 = 3.0;
    strcpy(str_tg + 0x48,"3.0");
    *sigma2 = 1.5;
    strcpy(str_trsh + 0x48,"1.5");
    *iter = 10;
    *alpha = 5.0;
    strcpy(str_delta + 0x48,"5.0");
    *delta = 1.0;
    strcpy(local_278,"1.0");
    *n_frame = 0;
    *nbin = 0;
    strcpy(i_fname,"Undefined");
    strcpy(v_fname,"Undefined");
    strcpy(c_fname,"Undefined");
    strcpy(h_fname,"Undefined");
  }
  else {
    error(1);
  }
  local_3c = 4;
  while (local_3c < argc) {
    iVar1 = strcmp("-A",argv[local_3c]);
    if (iVar1 == 0) {
      if (local_3c + 1 < argc) {
        __isoc99_sscanf(argv[local_3c + 1],"%f",alpha);
        strcpy(str_delta + 0x48,argv[local_3c + 1]);
        local_3c = local_3c + 2;
      }
      else {
        error(1);
      }
    }
    else {
      iVar1 = strcmp("-F",argv[local_3c]);
      if (iVar1 == 0) {
        if (local_3c + 1 < argc) {
          __isoc99_sscanf(argv[local_3c + 1],"%f",trsh);
          strcpy(str_alpha + 0x48,argv[local_3c + 1]);
          *sf = 1;
          local_3c = local_3c + 2;
        }
        else {
          error(1);
        }
      }
      else {
        iVar1 = strcmp("-C",argv[local_3c]);
        if (iVar1 == 0) {
          if (local_3c + 3 < argc) {
            strcpy(c_fname,argv[local_3c + 1]);
            __isoc99_sscanf(argv[local_3c + 2],"%d",nbin);
            __isoc99_sscanf(argv[local_3c + 3],"%f",incr);
            *histo = 1;
            local_3c = local_3c + 4;
          }
          else {
            error(1);
          }
        }
        else {
          iVar1 = strcmp("-I",argv[local_3c]);
          if (iVar1 == 0) {
            if (local_3c + 1 < argc) {
              __isoc99_sscanf(argv[local_3c + 1],"%d",iter);
              local_3c = local_3c + 2;
            }
            else {
              error(1);
            }
          }
          else {
            iVar1 = strcmp("-SG",argv[local_3c]);
            if (iVar1 == 0) {
              if (local_3c + 1 < argc) {
                __isoc99_sscanf(argv[local_3c + 1],"%f",sigma1);
                strcpy(str_tg + 0x48,argv[local_3c + 1]);
                local_3c = local_3c + 2;
              }
              else {
                error(1);
              }
            }
            else {
              iVar1 = strcmp("-TG",argv[local_3c]);
              if (iVar1 == 0) {
                if (local_3c + 1 < argc) {
                  __isoc99_sscanf(argv[local_3c + 1],"%f",sigma2);
                  strcpy(str_trsh + 0x48,argv[local_3c + 1]);
                  local_3c = local_3c + 2;
                }
                else {
                  error(1);
                }
              }
              else {
                iVar1 = strcmp("-M",argv[local_3c]);
                if (iVar1 == 0) {
                  if (local_3c + 1 < argc) {
                    __isoc99_sscanf(argv[local_3c + 1],"%d",n_frame);
                    local_3c = local_3c + 2;
                  }
                  else {
                    error(1);
                  }
                }
                else {
                  iVar1 = strcmp("-B",argv[local_3c]);
                  if (iVar1 == 0) {
                    if (local_3c + 2 < argc) {
                      __isoc99_sscanf(argv[local_3c + 1],"%d",col);
                      __isoc99_sscanf(argv[local_3c + 2],"%d",row);
                      *binary = 1;
                      local_3c = local_3c + 3;
                    }
                    else {
                      error(1);
                    }
                  }
                  else {
                    iVar1 = strcmp("-H",argv[local_3c]);
                    if (iVar1 == 0) {
                      *horn = 1;
                      local_3c = local_3c + 1;
                    }
                    else {
                      iVar1 = strcmp("-D",argv[local_3c]);
                      if (iVar1 == 0) {
                        if (local_3c + 1 < argc) {
                          __isoc99_sscanf(argv[local_3c + 1],"%f",delta);
                          strcpy(local_278,argv[local_3c + 1]);
                          local_3c = local_3c + 2;
                        }
                        else {
                          error(1);
                        }
                      }
                      else {
                        iVar1 = strcmp("-V",argv[local_3c]);
                        if (iVar1 == 0) {
                          if (local_3c + 1 < argc) {
                            *vmag = 1;
                            __isoc99_sscanf(argv[local_3c + 1],"%f",maxv);
                            local_3c = local_3c + 2;
                          }
                          else {
                            error(1);
                          }
                        }
                        else {
                          error(2);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (100 < *nbin) {
    error(0xf);
  }
  concat(argv[1],"/",in_path);
  concat(argv[2],"/",out_path);
  concat(in_path,argv[3],i_fname);
  strcpy(t0 + 0x48,"-sg");
  concat(t0 + 0x48,str_tg + 0x48,t0 + 0x48);
  concat(t0 + 0x48,"-tg",t0 + 0x48);
  concat(t0 + 0x48,str_trsh + 0x48,t0 + 0x48);
  concat(t0 + 0x48,"-m",t0 + 0x48);
  sprintf(str_sg + 0x48,"%d",(ulong)(uint)*n_frame);
  concat(t0 + 0x48,str_sg + 0x48,t0 + 0x48);
  concat(t0 + 0x48,"-i",t0 + 0x48);
  sprintf(str_sg + 0x48,"%d",(ulong)(uint)*iter);
  concat(t0 + 0x48,str_sg + 0x48,t0 + 0x48);
  concat(t0 + 0x48,"-a",t0 + 0x48);
  concat(t0 + 0x48,str_delta + 0x48,t0 + 0x48);
  if (*horn == 0) {
    concat(t0 + 0x48,"-d",t0 + 0x48);
    concat(t0 + 0x48,local_278,t0 + 0x48);
  }
  if (*horn != 0) {
    concat(t0 + 0x48,"-h",t0 + 0x48);
  }
  if (*sf != 0) {
    concat(t0 + 0x48,"-f",t0 + 0x48);
    concat(t0 + 0x48,str_alpha + 0x48,t0 + 0x48);
  }
  concat(out_path,*argv,v_fname);
  concat(v_fname,".",v_fname);
  concat(v_fname,argv[3],v_fname);
  concat(v_fname,"F",v_fname);
  concat(v_fname,t0 + 0x48,v_fname);
  if (*histo != 0) {
    concat(out_path,*argv,h_fname);
    concat(h_fname,".",h_fname);
    concat(h_fname,argv[3],h_fname);
    concat(h_fname,"H",h_fname);
    concat(h_fname,t0 + 0x48,h_fname);
  }
  printf(" Generated velocity filename  : %s\n",v_fname);
  printf(" Generated histogram filename : %s\n",h_fname);
  printf(" Input stem name              : %s\n",i_fname);
  printf(" Correct velocity filename    : %s\n",c_fname);
  fflush(_stdout);
  return;
}

Assistant:

void valid_option(argc,argv,in_path,out_path,sigma1,sigma2,histo,sf,trsh,
             i_fname,v_fname,c_fname,h_fname,nbin,incr,n_frame,alpha,
             delta,iter,binary,row,col,horn,vmag,maxv)
int argc ;
char *argv[] ;
int *nbin, *iter, *n_frame, *histo, *sf, *binary, *row, *col, *horn, *vmag ;
float *incr, *sigma1, *sigma2, *trsh, *alpha, *delta, *maxv ;
string in_path, out_path, i_fname, v_fname, c_fname, h_fname ;

{ int i ;
  string ext, t0, str_sg, str_tg, str_trsh, str_alpha, str_delta ;

  if (argc == 1) {
    usage() ;
  }
  if ((argc <= 28) && (argc >= 4)) {
    *binary = FALSE ;
    *horn = FALSE ;
    *vmag = FALSE ;
    *sf = FALSE ;
    *histo = FALSE ;
    *trsh = 0.0 ;
    *maxv = 0.0 ;
    *sigma1 = DEF_S1 ;
    strcpy(str_sg,"3.0") ;
    *sigma2 = DEF_S2 ;
    strcpy(str_tg,"1.5") ;
    *iter = RELAXITER ;
    *alpha = ALPHA ;
    strcpy(str_alpha,"5.0") ;
    *delta = DELTA ;
    strcpy(str_delta,"1.0") ;
    *n_frame = 0 ;
    *nbin = 0 ;
    strcpy(i_fname,"Undefined") ;
    strcpy(v_fname,"Undefined") ;
    strcpy(c_fname,"Undefined") ;
    strcpy(h_fname,"Undefined") ;
  }
  else {
    error(1) ;
  }
  i = 4 ;
  while (i < argc) {
    if (strcmp("-A",argv[i]) == 0) {
      if (i + 1 < argc) {
        sscanf(argv[i+1],"%f",alpha) ;
        strcpy(str_alpha,argv[i+1]) ;
        i += 2 ;
      }
      else {
        error(1) ;
      }
    }
    else {
      if (strcmp("-F",argv[i]) == 0) {
        if (i + 1 < argc) {
          sscanf(argv[i+1],"%f",trsh) ;
          strcpy(str_trsh,argv[i+1]) ;
          *sf = TRUE ;
          i += 2 ;
        }
        else {
          error(1) ;
        }
      }
      else {
        if (strcmp("-C",argv[i]) == 0) {
          if (i + 3 < argc) {
            strcpy(c_fname,argv[i+1]) ;
            sscanf(argv[i+2],"%d",nbin) ;
            sscanf(argv[i+3],"%f",incr) ;
            *histo = TRUE ;
            i += 4 ;
          }
          else {
            error(1) ;
          }
        }
        else {
          if (strcmp("-I",argv[i]) == 0) {
            if (i + 1 < argc) {
              sscanf(argv[i+1],"%d",iter) ;
              i += 2 ;
            }
            else {
              error(1) ;
            }
          }
          else {
            if (strcmp("-SG", argv[i]) == 0) {
              if (i + 1 < argc) {
                sscanf(argv[i+1],"%f",sigma1) ;
                strcpy(str_sg,argv[i+1]) ;
                i += 2 ;
              }
              else {
                error(1) ;
              }
            }
            else {
              if (strcmp("-TG",argv[i]) == 0) {
                if (i + 1 < argc) {
                  sscanf(argv[i+1],"%f",sigma2) ;
                  strcpy(str_tg,argv[i+1]) ;
                  i += 2 ;
                }
                else {
                  error(1) ;
                }
              }
              else {
                if (strcmp("-M",argv[i]) == 0) {
                  if (i + 1 < argc) {
                    sscanf(argv[i+1],"%d",n_frame) ;
                    i += 2 ;
                  }
                  else {
                    error(1) ;
                  }
                }
                else {
                  if (strcmp("-B",argv[i]) == 0) {
                    if (i + 2 < argc) {
                      sscanf(argv[i+1],"%d",col) ;
                      sscanf(argv[i+2],"%d",row) ;
                      *binary = TRUE ;
                      i += 3 ;
                    }
                    else {
                      error(1) ;
                    }
                  }
                  else {
                    if (strcmp("-H",argv[i]) == 0) {
                      *horn = TRUE ;
                      i++ ;
                    }
                    else {
                      if (strcmp("-D",argv[i]) == 0) {
                        if (i + 1 < argc) {
                          sscanf(argv[i+1],"%f",delta) ;
                          strcpy(str_delta,argv[i+1]) ;
                          i += 2 ;
                        }
                        else {
                          error(1) ;
                        }
                      }
                      else {
                        if (strcmp("-V",argv[i]) == 0) {
                          if (i + 1 < argc) {
                            *vmag = TRUE ;
                            sscanf(argv[i+1],"%f",maxv) ;
                            i += 2 ;
                          }
                          else {
                            error(1) ;
                          }
                        }
                        else {
                          error(2) ;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (*nbin > N_BINS) {
    error(15) ;
  }
  concat(argv[1],"/",in_path) ;
  concat(argv[2],"/",out_path) ;
  concat(in_path,argv[3],i_fname) ;
  strcpy(ext,"-sg") ;
  concat(ext,str_sg,ext) ;
  concat(ext,"-tg",ext) ;
  concat(ext,str_tg,ext) ;
  concat(ext,"-m",ext) ;
  sprintf(t0,"%d",*n_frame);
  concat(ext,t0,ext) ;
  concat(ext,"-i",ext) ;
  sprintf(t0,"%d",*iter);
  concat(ext,t0,ext) ;
  concat(ext,"-a",ext) ;
  concat(ext,str_alpha,ext) ;
  if (!(*horn)) {
    concat(ext,"-d",ext) ;
    concat(ext,str_delta,ext) ;
  }
  if (*horn) {
    concat(ext,"-h",ext) ;
  }
  if (*sf) {
    concat(ext,"-f",ext) ;
    concat(ext,str_trsh,ext) ;
  }
  concat(out_path,argv[0],v_fname) ;
  concat(v_fname,".",v_fname) ;
  concat(v_fname,argv[3],v_fname) ;
  concat(v_fname,"F",v_fname) ;
  concat(v_fname,ext,v_fname) ;
  if (*histo) {
    concat(out_path,argv[0],h_fname) ;
    concat(h_fname,".",h_fname) ;
    concat(h_fname,argv[3],h_fname) ;
    concat(h_fname,"H",h_fname) ;
    concat(h_fname,ext,h_fname) ;
  }
  printf(" Generated velocity filename  : %s\n",v_fname) ;
  printf(" Generated histogram filename : %s\n",h_fname) ;
  printf(" Input stem name              : %s\n",i_fname) ;
  printf(" Correct velocity filename    : %s\n",c_fname) ;
  fflush(stdout) ;
}